

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

bool rcg::setInteger(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,int64_t value,
                    bool exception)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  invalid_argument *piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  byte in_CL;
  undefined8 in_RDX;
  char *in_RSI;
  GenericException *ex;
  IInteger *val;
  INode *node;
  bool ret;
  IBase *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  long *local_1a8;
  allocator local_161;
  string local_160 [32];
  string local_140 [38];
  undefined1 local_11a;
  allocator local_119;
  string local_118 [32];
  string local_f8 [38];
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [32];
  long *local_90;
  gcstring local_78 [80];
  long local_28;
  byte local_1a;
  byte local_19;
  undefined8 local_18;
  char *local_10;
  long lVar4;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  peVar3 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15a54f);
  GenICam_3_4::gcstring::gcstring(local_78,local_10);
  iVar2 = (*(peVar3->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar3,local_78);
  lVar4 = CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring(local_78);
  local_28 = lVar4;
  if (lVar4 == 0) {
    if ((local_19 & 1) != 0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_160,"Feature not found: ",&local_161);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffe20);
      std::invalid_argument::invalid_argument((invalid_argument *)__lhs,local_140);
      __cxa_throw(__lhs,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    bVar1 = GenApi_3_4::IsWritable(in_stack_fffffffffffffe20);
    if (bVar1) {
      if (local_28 == 0) {
        local_1a8 = (long *)0x0;
      }
      else {
        local_1a8 = (long *)__dynamic_cast(local_28,&GenApi_3_4::INode::typeinfo,
                                           &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
      }
      local_90 = local_1a8;
      if (local_1a8 == (long *)0x0) {
        if ((local_19 & 1) != 0) {
          local_d2 = 1;
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_d0,"Feature not integer: ",&local_d1);
          std::operator+(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
          std::invalid_argument::invalid_argument(piVar5,local_b0);
          local_d2 = 0;
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        (**(code **)(*local_1a8 + 0x38))(local_1a8,local_18,1);
        local_1a = 1;
      }
    }
    else if ((local_19 & 1) != 0) {
      local_11a = 1;
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,"Feature not writable: ",&local_119);
      std::operator+(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
      std::invalid_argument::invalid_argument(piVar5,local_f8);
      local_11a = 0;
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return (bool)(local_1a & 1);
}

Assistant:

bool setInteger(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                int64_t value, bool exception)
{
  bool ret=false;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsWritable(node))
      {
        GenApi::IInteger *val=dynamic_cast<GenApi::IInteger *>(node);

        if (val != 0)
        {
          val->SetValue(value);
          ret=true;
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not integer: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not writable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}